

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_moves_8_pi(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) == 0) {
    m68ki_exception_illegal();
    return;
  }
  if (m68ki_cpu.s_flag != 0) {
    uVar2 = m68ki_read_imm_16();
    uVar3 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
    m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = uVar3 + 1;
    if ((uVar2 >> 0xb & 1) == 0) {
      if ((short)uVar2 < 0) {
        uVar3 = m68ki_read_8_fc(uVar3,m68ki_cpu.sfc);
        *(int *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 10 & 0x1c) + 0x20) = (int)(char)uVar3;
      }
      else {
        uVar4 = (ulong)(uVar2 >> 10 & 0x1c);
        uVar1 = *(uint *)((long)m68ki_cpu.dar + uVar4);
        uVar3 = m68ki_read_8_fc(uVar3,m68ki_cpu.sfc);
        *(uint *)((long)m68ki_cpu.dar + uVar4) = uVar3 | uVar1 & 0xffffff00;
      }
      if (((ushort)m68ki_cpu.cpu_type & 0x18) != 0) {
        m68ki_remaining_cycles = m68ki_remaining_cycles + -2;
      }
      return;
    }
    m68ki_write_8_fc(uVar3,m68ki_cpu.dfc,
                     (uint)*(byte *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 10 & 0x3c)));
    return;
  }
  m68ki_exception_privilege_violation();
  return;
}

Assistant:

static void m68k_op_moves_8_pi(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		if(FLAG_S)
		{
			uint word2 = OPER_I_16();
			uint ea = EA_AY_PI_8();

			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			if(BIT_B(word2))		   /* Register to memory */
			{
				m68ki_write_8_fc(ea, REG_DFC, MASK_OUT_ABOVE_8(REG_DA[(word2 >> 12) & 15]));
				return;
			}
			if(BIT_F(word2))		   /* Memory to address register */
			{
				REG_A[(word2 >> 12) & 7] = MAKE_INT_8(m68ki_read_8_fc(ea, REG_SFC));
				if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
					USE_CYCLES(2);
				return;
			}
			/* Memory to data register */
			REG_D[(word2 >> 12) & 7] = MASK_OUT_BELOW_8(REG_D[(word2 >> 12) & 7]) | m68ki_read_8_fc(ea, REG_SFC);
			if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
				USE_CYCLES(2);
			return;
		}
		m68ki_exception_privilege_violation();
		return;
	}
	m68ki_exception_illegal();
}